

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mostream.hh
# Opt level: O3

void __thiscall OpenMesh::multiplex_streambuf::~multiplex_streambuf(multiplex_streambuf *this)

{
  pointer pcVar1;
  pointer ppbVar2;
  _Rb_tree_node_base *p_Var3;
  
  *(undefined ***)this = &PTR__multiplex_streambuf_001c2bd8;
  for (p_Var3 = (this->target_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->target_map_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var3[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var3[1]._M_parent + 8))();
    }
  }
  pcVar1 = (this->buffer_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->buffer_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_OpenMesh::basic_multiplex_target_*>,_std::_Select1st<std::pair<void_*const,_OpenMesh::basic_multiplex_target_*>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_OpenMesh::basic_multiplex_target_*>_>_>
  ::~_Rb_tree(&(this->target_map_)._M_t);
  ppbVar2 = (this->targets_).
            super__Vector_base<OpenMesh::basic_multiplex_target_*,_std::allocator<OpenMesh::basic_multiplex_target_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppbVar2 != (pointer)0x0) {
    operator_delete(ppbVar2);
  }
  *(code **)this = __assert_fail;
  std::locale::~locale((locale *)&this->field_0x38);
  return;
}

Assistant:

~multiplex_streambuf()
  {
    tmap_iter t_it(target_map_.begin()), t_end(target_map_.end());
    for (; t_it!=t_end; ++t_it)
      delete t_it->second;
  }